

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall mkvmuxer::Cues::AddCue(Cues *this,CuePoint *cue)

{
  int iVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  CuePoint *in_RSI;
  int *in_RDI;
  int32_t i;
  CuePoint **cues;
  int32_t new_capacity;
  int local_3c;
  int local_2c;
  
  if (in_RSI == (CuePoint *)0x0) {
    return false;
  }
  if (*in_RDI < in_RDI[1] + 1) {
    if (*in_RDI == 0) {
      local_3c = 2;
    }
    else {
      local_3c = *in_RDI << 1;
    }
    if (local_3c < 1) {
      return false;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)local_3c;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3,(nothrow_t *)&std::nothrow);
    if (pvVar4 == (void *)0x0) {
      return false;
    }
    for (local_2c = 0; local_2c < in_RDI[1]; local_2c = local_2c + 1) {
      *(undefined8 *)((long)pvVar4 + (long)local_2c * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 2) + (long)local_2c * 8);
    }
    if (*(void **)(in_RDI + 2) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 2));
    }
    *(void **)(in_RDI + 2) = pvVar4;
    *in_RDI = local_3c;
  }
  CuePoint::set_output_block_number(in_RSI,(bool)(*(byte *)(in_RDI + 4) & 1));
  iVar1 = in_RDI[1];
  in_RDI[1] = iVar1 + 1;
  *(CuePoint **)(*(long *)(in_RDI + 2) + (long)iVar1 * 8) = in_RSI;
  return true;
}

Assistant:

bool Cues::AddCue(CuePoint* cue) {
  if (!cue)
    return false;

  if ((cue_entries_size_ + 1) > cue_entries_capacity_) {
    // Add more CuePoints.
    const int32_t new_capacity =
        (!cue_entries_capacity_) ? 2 : cue_entries_capacity_ * 2;

    if (new_capacity < 1)
      return false;

    CuePoint** const cues =
        new (std::nothrow) CuePoint*[new_capacity];  // NOLINT
    if (!cues)
      return false;

    for (int32_t i = 0; i < cue_entries_size_; ++i) {
      cues[i] = cue_entries_[i];
    }

    delete[] cue_entries_;

    cue_entries_ = cues;
    cue_entries_capacity_ = new_capacity;
  }

  cue->set_output_block_number(output_block_number_);
  cue_entries_[cue_entries_size_++] = cue;
  return true;
}